

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowDock(ImGuiWindow *window,ImGuiID dock_id,ImGuiCond cond)

{
  bool bVar1;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *new_node;
  ImGuiContext *ctx;
  ImGuiCond cond_local;
  ImGuiID dock_id_local;
  ImGuiWindow *window_local;
  
  if (((cond == 0) || ((*(int *)&window->field_0xf0 >> 0x18 & cond) != 0)) &&
     (*(uint *)&window->field_0xf0 =
           *(uint *)&window->field_0xf0 & 0xffffff |
           (*(int *)&window->field_0xf0 >> 0x18 & 0xf1U) << 0x18, window->DockId != dock_id)) {
    pIVar2 = DockContextFindNodeByID(GImGui,dock_id);
    ctx._4_4_ = dock_id;
    if ((pIVar2 != (ImGuiDockNode *)0x0) && (bVar1 = ImGuiDockNode::IsSplitNode(pIVar2), bVar1)) {
      pIVar2 = DockNodeGetRootNode(pIVar2);
      if (pIVar2->CentralNode == (ImGuiDockNode *)0x0) {
        ctx._4_4_ = pIVar2->LastFocusedNodeId;
      }
      else {
        bVar1 = ImGuiDockNode::IsCentralNode(pIVar2->CentralNode);
        if (!bVar1) {
          __assert_fail("new_node->CentralNode->IsCentralNode()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                        ,0x3f82,"void ImGui::SetWindowDock(ImGuiWindow *, ImGuiID, ImGuiCond)");
        }
        ctx._4_4_ = pIVar2->CentralNode->ID;
      }
    }
    if (window->DockId != ctx._4_4_) {
      if (window->DockNode != (ImGuiDockNode *)0x0) {
        DockNodeRemoveWindow(window->DockNode,window,0);
      }
      window->DockId = ctx._4_4_;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowDock(ImGuiWindow* window, ImGuiID dock_id, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowDockAllowFlags & cond) == 0)
        return;
    window->SetWindowDockAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    if (window->DockId == dock_id)
        return;

    // If the user attempt to set a dock id that is a split node, we'll dig within to find a suitable docking spot
    ImGuiContext* ctx = GImGui;
    if (ImGuiDockNode* new_node = DockContextFindNodeByID(ctx, dock_id))
        if (new_node->IsSplitNode())
        {
            // Policy: Find central node or latest focused node. We first move back to our root node.
            new_node = DockNodeGetRootNode(new_node);
            if (new_node->CentralNode)
            {
                IM_ASSERT(new_node->CentralNode->IsCentralNode());
                dock_id = new_node->CentralNode->ID;
            }
            else
            {
                dock_id = new_node->LastFocusedNodeId;
            }
        }

    if (window->DockId == dock_id)
        return;

    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, 0);
    window->DockId = dock_id;
}